

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptNativeIntArray::SetItem(JavascriptNativeIntArray *this,uint32 index,int32 iValue)

{
  bool bVar1;
  JavascriptArray *this_00;
  ScriptContext *scriptContext;
  JavascriptArray *varArr;
  int32 iValue_local;
  uint32 index_local;
  JavascriptNativeIntArray *this_local;
  undefined8 local_10;
  
  if (iValue == -0x7fffe) {
    this_00 = ToVarArray(this);
    scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    bVar1 = TaggedInt::IsOverflow(-0x7fffe);
    if (bVar1) {
      local_10 = JavascriptNumber::NewInlined(-524286.0,scriptContext);
    }
    else {
      local_10 = TaggedInt::ToVarUnchecked(-0x7fffe);
    }
    Js::JavascriptArray::DirectSetItemAt<void*>(this_00,index,local_10);
  }
  else {
    Js::JavascriptArray::DirectSetItemAt<int>((JavascriptArray *)this,index,iValue);
  }
  return 1;
}

Assistant:

BOOL JavascriptNativeIntArray::SetItem(uint32 index, int32 iValue)
    {
        if (iValue == JavascriptNativeIntArray::MissingItem)
        {
            JavascriptArray *varArr = JavascriptNativeIntArray::ToVarArray(this);
            varArr->DirectSetItemAt(index, JavascriptNumber::ToVar(iValue, GetScriptContext()));
            return TRUE;
        }

        this->DirectSetItemAt(index, iValue);
        return TRUE;
    }